

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ClosePopupToLevel(int remaining)

{
  int iVar1;
  ImGuiPopupRef *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiPopupRef *__dest;
  uint uVar5;
  ulong uVar6;
  ImGuiWindow *window;
  
  pIVar3 = GImGui;
  if (remaining < 0) {
    __assert_fail("remaining >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1391,"void ClosePopupToLevel(int)");
  }
  iVar1 = (GImGui->OpenPopupStack).Size;
  if (remaining == 0) {
    if (iVar1 < 1) goto LAB_0017d4d0;
    ppIVar4 = &((GImGui->OpenPopupStack).Data)->ParentWindow;
  }
  else {
    if (iVar1 < remaining) {
LAB_0017d4d0:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c0,
                    "value_type &ImVector<ImGuiPopupRef>::operator[](int) [T = ImGuiPopupRef]");
    }
    ppIVar4 = &(GImGui->OpenPopupStack).Data[(ulong)(uint)remaining - 1].Window;
  }
  window = *ppIVar4;
  if ((GImGui->NavLayer == 0) && (window->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
    window = window->NavLastChildNavWindow;
  }
  ImGui::FocusWindow(window);
  (window->DC).NavHideHighlightOneFrame = true;
  iVar1 = (pIVar3->OpenPopupStack).Capacity;
  if (iVar1 < remaining) {
    if (iVar1 == 0) {
      uVar5 = 8;
    }
    else {
      uVar5 = iVar1 / 2 + iVar1;
    }
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 <= remaining) {
      uVar6 = (ulong)(uint)remaining;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)(uVar6 * 0x30,GImAllocatorUserData);
    pIVar2 = (pIVar3->OpenPopupStack).Data;
    if (pIVar2 != (ImGuiPopupRef *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar3->OpenPopupStack).Size * 0x30);
      pIVar2 = (pIVar3->OpenPopupStack).Data;
      if (pIVar2 != (ImGuiPopupRef *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar3->OpenPopupStack).Data = __dest;
    (pIVar3->OpenPopupStack).Capacity = (int)uVar6;
  }
  (pIVar3->OpenPopupStack).Size = remaining;
  return;
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    IM_ASSERT(remaining >= 0);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* focus_window = (remaining > 0) ? g.OpenPopupStack[remaining-1].Window : g.OpenPopupStack[0].ParentWindow;
    if (g.NavLayer == 0)
        focus_window = NavRestoreLastChildNavWindow(focus_window);
    ImGui::FocusWindow(focus_window);
    focus_window->DC.NavHideHighlightOneFrame = true;
    g.OpenPopupStack.resize(remaining);
}